

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

ApplicationInfoFilter *
Fossilize::ApplicationInfoFilter::parse
          (char *path,_func_char_ptr_char_ptr_void_ptr *getenv_wrapper,void *userdata)

{
  Impl *this;
  bool bVar1;
  ApplicationInfoFilter *this_00;
  
  this_00 = (ApplicationInfoFilter *)operator_new(8);
  ApplicationInfoFilter(this_00);
  this = this_00->impl;
  this->getenv_wrapper = getenv_wrapper;
  this->getenv_userdata = userdata;
  bVar1 = Impl::parse(this,path);
  if (!bVar1) {
    ~ApplicationInfoFilter(this_00);
    operator_delete(this_00,8);
    this_00 = (ApplicationInfoFilter *)0x0;
  }
  return this_00;
}

Assistant:

ApplicationInfoFilter *ApplicationInfoFilter::parse(
		const char *path,
		const char *(*getenv_wrapper)(const char *, void *),
		void *userdata)
{
	auto *filter = new ApplicationInfoFilter;

	filter->impl->getenv_wrapper = getenv_wrapper;
	filter->impl->getenv_userdata = userdata;

	if (!filter->impl->parse(path))
	{
		delete filter;
		return nullptr;
	}

	return filter;
}